

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsPopupOpen(ImGuiID id,ImGuiPopupFlags popup_flags)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  
  if ((char)popup_flags < '\0') {
    if (id != 0) {
      __assert_fail("id == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x22c1,"bool ImGui::IsPopupOpen(ImGuiID, ImGuiPopupFlags)");
    }
    iVar4 = (GImGui->OpenPopupStack).Size;
    if (((uint)popup_flags >> 8 & 1) == 0) {
      iVar1 = (GImGui->BeginPopupStack).Size;
      bVar7 = SBORROW4(iVar4,iVar1);
      bVar6 = iVar4 == iVar1;
      iVar4 = iVar4 - iVar1;
    }
    else {
      bVar7 = false;
      bVar6 = iVar4 == 0;
    }
    bVar6 = !bVar6 && bVar7 == iVar4 < 0;
  }
  else {
    uVar2 = (GImGui->OpenPopupStack).Size;
    if (((uint)popup_flags >> 8 & 1) == 0) {
      uVar3 = (GImGui->BeginPopupStack).Size;
      if ((int)uVar3 < (int)uVar2) {
        if (-1 < (int)uVar3) {
          return (GImGui->OpenPopupStack).Data[uVar3].PopupId == id;
        }
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                      ,0x706,"T &ImVector<ImGuiPopupData>::operator[](int) [T = ImGuiPopupData]");
      }
    }
    else if (0 < (int)uVar2) {
      lVar5 = 0;
      do {
        bVar6 = *(ImGuiID *)((long)&((GImGui->OpenPopupStack).Data)->PopupId + lVar5) == id;
        if (bVar6) {
          return bVar6;
        }
        bVar7 = (ulong)uVar2 * 0x30 + -0x30 != lVar5;
        lVar5 = lVar5 + 0x30;
      } while (bVar7);
      return bVar6;
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ImGui::IsPopupOpen(ImGuiID id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    if (popup_flags & ImGuiPopupFlags_AnyPopupId)
    {
        // Return true if any popup is open at the current BeginPopup() level of the popup stack
        // This may be used to e.g. test for another popups already opened to handle popups priorities at the same level.
        IM_ASSERT(id == 0);
        if (popup_flags & ImGuiPopupFlags_AnyPopupLevel)
            return g.OpenPopupStack.Size > 0;
        else
            return g.OpenPopupStack.Size > g.BeginPopupStack.Size;
    }
    else
    {
        if (popup_flags & ImGuiPopupFlags_AnyPopupLevel)
        {
            // Return true if the popup is open anywhere in the popup stack
            for (int n = 0; n < g.OpenPopupStack.Size; n++)
                if (g.OpenPopupStack[n].PopupId == id)
                    return true;
            return false;
        }
        else
        {
            // Return true if the popup is open at the current BeginPopup() level of the popup stack (this is the most-common query)
            return g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].PopupId == id;
        }
    }
}